

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hadamard.cpp
# Opt level: O0

void test_qclab_qgates_Hadamard<std::complex<double>>(void)

{
  allocator<std::complex<double>_> *paVar1;
  undefined1 *this;
  double dVar2;
  double dVar3;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  bool bVar4;
  char *pcVar5;
  reference lhs;
  complex<double> *pcVar6;
  char *in_R9;
  undefined8 uVar7;
  undefined8 uVar8;
  complex<double> local_af0;
  complex<double> local_ae0;
  complex<double> local_ad0;
  complex<double> local_ac0;
  complex<double> local_ab0;
  complex<double> local_aa0;
  complex<double> local_a90;
  complex<double> local_a80;
  complex<double> local_a70;
  complex<double> local_a60;
  complex<double> local_a50;
  complex<double> local_a40;
  complex<double> local_a30;
  complex<double> local_a20;
  complex<double> local_a10;
  complex<double> local_a00;
  complex<double> local_9f0 [4];
  iterator local_9b0;
  undefined8 local_9a8;
  allocator<std::complex<double>_> local_999;
  complex<double> local_998;
  complex<double> local_988;
  complex<double> local_978;
  complex<double> local_968;
  complex<double> local_958;
  complex<double> local_948;
  complex<double> local_938;
  complex<double> local_928;
  complex<double> local_918;
  complex<double> local_908;
  complex<double> local_8f8;
  complex<double> local_8e8;
  complex<double> local_8d8;
  complex<double> local_8c8;
  complex<double> local_8b8;
  complex<double> local_8a8;
  complex<double> local_898 [4];
  iterator local_858;
  size_type local_850;
  undefined1 local_848 [8];
  V check2;
  V vec2;
  complex<double> local_810;
  complex<double> local_800;
  complex<double> local_7f0;
  complex<double> local_7e0;
  complex<double> local_7d0;
  complex<double> local_7c0;
  complex<double> local_7b0;
  complex<double> local_7a0;
  complex<double> local_790 [2];
  iterator local_770;
  size_type local_768;
  undefined1 local_760 [8];
  V check1;
  V vec1;
  Hadamard<std::complex<double>_> H1;
  Hadamard<std::complex<double>_> H0;
  complex<double> local_708;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  iterator local_6c8;
  size_type local_6c0;
  undefined1 local_6b8 [8];
  V v2;
  complex<double> local_698;
  undefined8 local_688;
  undefined8 uStack_680;
  iterator local_678;
  size_type local_670;
  undefined1 local_668 [8];
  V v1;
  R c;
  AssertHelper local_628;
  Message local_620;
  bool local_611;
  undefined1 local_610 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_5e0;
  Message local_5d8;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__2;
  Hadamard<std::complex<double>_> H2;
  AssertHelper local_588;
  Message local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_15;
  Message local_540;
  int local_538;
  int local_534;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_14;
  stringstream qasm;
  ostream local_510 [376];
  AssertHelper local_398;
  Message local_390;
  double local_388;
  SquareMatrix<std::complex<double>_> local_380;
  double local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_13;
  Message local_350;
  double local_348;
  SquareMatrix<std::complex<double>_> local_340;
  double local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_12;
  Message local_310;
  double local_308;
  SquareMatrix<std::complex<double>_> local_300;
  double local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_11;
  Message local_2d0;
  double local_2c8;
  SquareMatrix<std::complex<double>_> local_2c0;
  double local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_10;
  Message local_290;
  SquareMatrix<std::complex<double>_> local_288;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_9;
  Message local_260;
  SquareMatrix<std::complex<double>_> local_258;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_8;
  Message local_230;
  SquareMatrix<std::complex<double>_> local_228;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_7;
  Message local_200;
  SquareMatrix<std::complex<double>_> local_1f8;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_6;
  Message local_1d0;
  int local_1c8;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  int qnew;
  Message local_1a0;
  int local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  int local_16c;
  size_type local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  vector<int,_std::allocator<int>_> qubits;
  Message local_130;
  int local_128;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  int local_100;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  Message local_50;
  int local_48 [5];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  Hadamard<std::complex<double>_> H;
  R tol;
  
  std::numeric_limits<double>::epsilon();
  qclab::qgates::Hadamard<std::complex<double>_>::Hadamard
            ((Hadamard<std::complex<double>_> *)&gtest_ar.message_);
  local_34 = qclab::qgates::QGate1<std::complex<double>_>::nbQubits
                       ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_48[0] = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"H.nbQubits()","1",&local_34,local_48);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar4) {
    testing::Message::Message(&local_50);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x1b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_69 = qclab::qgates::Hadamard<std::complex<double>_>::fixed
                       ((Hadamard<std::complex<double>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar4) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_68,(AssertionResult *)"H.fixed()",
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x1c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  bVar4 = qclab::qgates::QGate1<std::complex<double>_>::controlled
                    ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_b1 = (bool)(~bVar4 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar4) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_b0,
               (AssertionResult *)"H.controlled()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x1d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_fc = qclab::qgates::QGate1<std::complex<double>_>::qubit
                       ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_100 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f8,"H.qubit()","0",&local_fc,&local_100);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar4) {
    testing::Message::Message(&local_108);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x20,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)&gtest_ar.message_,2);
  local_124 = qclab::qgates::QGate1<std::complex<double>_>::qubit
                        ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_128 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_120,"H.qubit()","2",&local_124,&local_128);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar4) {
    testing::Message::Message(&local_130);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x22,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_130);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  qclab::qgates::QGate1<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,
             (QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_168 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  local_16c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_160,"qubits.size()","1",&local_168,&local_16c);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar4) {
    testing::Message::Message(&local_178);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x26,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  lhs = std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,0);
  local_194 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_190,"qubits[0]","2",lhs,&local_194);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar4) {
    testing::Message::Message(&local_1a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x27,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe58,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe58);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  qclab::qgates::QGate1<std::complex<double>_>::setQubits
            ((QGate1<std::complex<double>_> *)&gtest_ar.message_,
             (int *)((long)&gtest_ar_5.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_1c4 = qclab::qgates::QGate1<std::complex<double>_>::qubit
                        ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_1c8 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c0,"H.qubit()","3",&local_1c4,&local_1c8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar4) {
    testing::Message::Message(&local_1d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x2a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_1f8);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_1f8,0,0);
  dVar2 = std::real<double>(pcVar6);
  dVar3 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1e8,"std::real( H.matrix()(0,0) )","1.0 / std::sqrt( 2.0 )","tol",
             dVar2,1.0 / dVar3,2.220446049250313e-15);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1f8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar4) {
    testing::Message::Message(&local_200);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x2d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_228);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_228,1,0);
  dVar2 = std::real<double>(pcVar6);
  dVar3 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_218,"std::real( H.matrix()(1,0) )","1.0 / std::sqrt( 2.0 )","tol",
             dVar2,1.0 / dVar3,2.220446049250313e-15);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_228);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar4) {
    testing::Message::Message(&local_230);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x2e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_258);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_258,0,1);
  dVar2 = std::real<double>(pcVar6);
  dVar3 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_248,"std::real( H.matrix()(0,1) )","1.0 / std::sqrt( 2.0 )","tol",
             dVar2,1.0 / dVar3,2.220446049250313e-15);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_258);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar4) {
    testing::Message::Message(&local_260);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x2f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_288);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_288,1,1);
  dVar2 = std::real<double>(pcVar6);
  dVar3 = sqrt(2.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_278,"std::real( H.matrix()(1,1) )","-1.0 / std::sqrt( 2.0 )","tol",
             dVar2,-1.0 / dVar3,2.220446049250313e-15);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_288);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar4) {
    testing::Message::Message(&local_290);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x30,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_2c0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_2c0,0,0);
  local_2b0 = std::imag<double>(pcVar6);
  local_2c8 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2a8,"std::imag( H.matrix()(0,0) )","0.0",&local_2b0,&local_2c8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_2c0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar4) {
    testing::Message::Message(&local_2d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x31,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_300);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_300,1,0);
  local_2f0 = std::imag<double>(pcVar6);
  local_308 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2e8,"std::imag( H.matrix()(1,0) )","0.0",&local_2f0,&local_308);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_300);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar4) {
    testing::Message::Message(&local_310);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x32,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_340);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_340,0,1);
  local_330 = std::imag<double>(pcVar6);
  local_348 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_328,"std::imag( H.matrix()(0,1) )","0.0",&local_330,&local_348);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_340);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar4) {
    testing::Message::Message(&local_350);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x33,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  qclab::qgates::Hadamard<std::complex<double>_>::matrix
            ((Hadamard<std::complex<double>_> *)&local_380);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_380,1,1);
  local_370 = std::imag<double>(pcVar6);
  local_388 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_368,"std::imag( H.matrix()(1,1) )","0.0",&local_370,&local_388);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_380);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar4) {
    testing::Message::Message(&local_390);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x34,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  qclab::qgates::QGate1<std::complex<double>_>::print
            ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_14.message_);
  local_534 = qclab::qgates::Hadamard<std::complex<double>_>::toQASM
                        ((Hadamard<std::complex<double>_> *)&gtest_ar.message_,local_510,0);
  local_538 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_530,"H.toQASM( qasm )","0",&local_534,&local_538);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar4) {
    testing::Message::Message(&local_540);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x3b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_558,"qasm.str()","\"h q[3];\\n\"",&local_578,
             (char (*) [9])"h q[3];\n");
  std::__cxx11::string::~string((string *)&local_578);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar4) {
    testing::Message::Message(&local_580);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x3c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&H2.super_QGate1<std::complex<double>_>.qubit_);
  std::__cxx11::string::~string((string *)&H2.super_QGate1<std::complex<double>_>.qubit_);
  qclab::qgates::Hadamard<std::complex<double>_>::Hadamard
            ((Hadamard<std::complex<double>_> *)&gtest_ar__2.message_);
  local_5c9 = qclab::QObject<std::complex<double>_>::operator==
                        ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                         (QObject<std::complex<double>_> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar4) {
    testing::Message::Message(&local_5d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_5c8,(AssertionResult *)"H == H2",
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x41,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  bVar4 = qclab::QObject<std::complex<double>_>::operator!=
                    ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                     (QObject<std::complex<double>_> *)&gtest_ar__2.message_);
  local_611 = (bool)(~bVar4 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_610,&local_611,(type *)0x0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar4) {
    testing::Message::Message(&local_620);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&c,(internal *)local_610,(AssertionResult *)"H != H2","true","false",in_R9)
    ;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_628,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/Hadamard.cpp"
               ,0x42,pcVar5);
    testing::internal::AssertHelper::operator=(&local_628,&local_620);
    testing::internal::AssertHelper::~AssertHelper(&local_628);
    std::__cxx11::string::~string((string *)&c);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  dVar2 = sqrt(2.0);
  v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(1.0 / dVar2);
  local_688 = 0x4014000000000000;
  uStack_680 = 0;
  local_698._M_value._0_8_ = 0x4008000000000000;
  local_698._M_value._8_8_ = 0;
  local_678 = &local_698;
  local_670 = 2;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&v2.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_03._M_len = local_670;
  __l_03._M_array = local_678;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_668,
             __l_03,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&v2.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_6d8 = 0x401c000000000000;
  uStack_6d0 = 0;
  local_6e8 = 0x4000000000000000;
  uStack_6e0 = 0;
  local_6f8 = 0x4014000000000000;
  uStack_6f0 = 0;
  local_708._M_value._0_8_ = 0x4008000000000000;
  local_708._M_value._8_8_ = 0;
  local_6c8 = &local_708;
  local_6c0 = 4;
  this = &H0.super_QGate1<std::complex<double>_>.field_0xf;
  std::allocator<std::complex<double>_>::allocator((allocator<std::complex<double>_> *)this);
  __l_02._M_len = local_6c0;
  __l_02._M_array = local_6c8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8,
             __l_02,(allocator_type *)this);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)&H0.super_QGate1<std::complex<double>_>.field_0xf);
  qclab::qgates::Hadamard<std::complex<double>_>::Hadamard
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_,0);
  qclab::qgates::Hadamard<std::complex<double>_>::Hadamard
            ((Hadamard<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_668);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_,
             NoTrans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  uVar7 = 0;
  std::complex<double>::complex(&local_7b0,3.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7b0);
  uVar8 = 0;
  local_7a0._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_7d0,5.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7d0);
  local_7c0._M_value._8_8_ = uVar8;
  std::operator+(&local_7a0,&local_7c0);
  uVar7 = 0;
  std::complex<double>::complex(&local_7f0,3.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7f0);
  uVar8 = 0;
  local_7e0._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_810,5.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_810);
  local_800._M_value._8_8_ = uVar8;
  std::operator-(&local_7e0,&local_800);
  local_770 = local_790;
  local_768 = 2;
  paVar1 = (allocator<std::complex<double>_> *)
           ((long)&vec2.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<double>_>::allocator(paVar1);
  __l_01._M_len = local_768;
  __l_01._M_array = local_770;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_760,
             __l_01,paVar1);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&vec2.
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_760);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_668);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_,Trans
             ,1,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                &check1.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_760);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_668);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_,
             ConjTrans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_760);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_,
             NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  uVar7 = 0;
  std::complex<double>::complex(&local_8b8,3.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8b8);
  uVar8 = 0;
  local_8a8._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_8d8,2.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8d8);
  local_8c8._M_value._8_8_ = uVar8;
  std::operator+(&local_8a8,&local_8c8);
  uVar7 = 0;
  std::complex<double>::complex(&local_8f8,5.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8f8);
  uVar8 = 0;
  local_8e8._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_918,7.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_918);
  local_908._M_value._8_8_ = uVar8;
  std::operator+(&local_8e8,&local_908);
  uVar7 = 0;
  std::complex<double>::complex(&local_938,3.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_938);
  uVar8 = 0;
  local_928._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_958,2.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_958);
  local_948._M_value._8_8_ = uVar8;
  std::operator-(&local_928,&local_948);
  uVar7 = 0;
  std::complex<double>::complex(&local_978,5.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_978);
  uVar8 = 0;
  local_968._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_998,7.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_998);
  local_988._M_value._8_8_ = uVar8;
  std::operator-(&local_968,&local_988);
  local_858 = local_898;
  local_850 = 4;
  std::allocator<std::complex<double>_>::allocator(&local_999);
  __l_00._M_len = local_850;
  __l_00._M_array = local_858;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848,
             __l_00,&local_999);
  std::allocator<std::complex<double>_>::~allocator(&local_999);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_,Trans
             ,2,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                &check2.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_,
             ConjTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  uVar7 = 0;
  std::complex<double>::complex(&local_a10,3.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a10);
  uVar8 = 0;
  local_a00._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_a30,5.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a30);
  local_a20._M_value._8_8_ = uVar8;
  std::operator+(&local_a00,&local_a20);
  uVar7 = 0;
  std::complex<double>::complex(&local_a50,3.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a50);
  uVar8 = 0;
  local_a40._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_a70,5.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a70);
  local_a60._M_value._8_8_ = uVar8;
  std::operator-(&local_a40,&local_a60);
  uVar7 = 0;
  std::complex<double>::complex(&local_a90,2.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a90);
  uVar8 = 0;
  local_a80._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_ab0,7.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_ab0);
  local_aa0._M_value._8_8_ = uVar8;
  std::operator+(&local_a80,&local_aa0);
  uVar7 = 0;
  std::complex<double>::complex(&local_ad0,2.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_ad0);
  uVar8 = 0;
  local_ac0._M_value._8_8_ = uVar7;
  std::complex<double>::complex(&local_af0,7.0,0.0);
  std::operator*((double *)
                 &v1.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_af0);
  local_ae0._M_value._8_8_ = uVar8;
  std::operator-(&local_ac0,&local_ae0);
  local_9b0 = local_9f0;
  local_9a8 = 4;
  __l._M_len = 4;
  __l._M_array = local_9b0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848,__l);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8);
  qclab::qgates::Hadamard<std::complex<double>_>::apply
            ((Hadamard<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  check_Hadamard<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_848);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_760);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::Hadamard<std::complex<double>_>::~Hadamard
            ((Hadamard<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::Hadamard<std::complex<double>_>::~Hadamard
            ((Hadamard<std::complex<double>_> *)&H1.super_QGate1<std::complex<double>_>.qubit_);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_6b8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_668);
  qclab::qgates::Hadamard<std::complex<double>_>::~Hadamard
            ((Hadamard<std::complex<double>_> *)&gtest_ar__2.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_14.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  qclab::qgates::Hadamard<std::complex<double>_>::~Hadamard
            ((Hadamard<std::complex<double>_> *)&gtest_ar.message_);
  return;
}

Assistant:

void test_qclab_qgates_Hadamard() {

  using R = qclab::real_t< T > ;
  const R tol = 10 * std::numeric_limits< R >::epsilon() ;

  qclab::qgates::Hadamard< T >  H ;

  EXPECT_EQ( H.nbQubits() , 1 ) ;   // nbQubits
  EXPECT_TRUE( H.fixed() ) ;        // fixed
  EXPECT_FALSE( H.controlled() ) ;  // controlled

  // qubit
  EXPECT_EQ( H.qubit() , 0 ) ;
  H.setQubit( 2 ) ;
  EXPECT_EQ( H.qubit() , 2 ) ;

  // qubits
  auto qubits = H.qubits() ;
  EXPECT_EQ( qubits.size() , 1 ) ;
  EXPECT_EQ( qubits[0] , 2 ) ;
  int qnew = 3 ;
  H.setQubits( &qnew ) ;
  EXPECT_EQ( H.qubit() , 3 ) ;

  // matrix
  EXPECT_NEAR( std::real( H.matrix()(0,0) ) ,  1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_NEAR( std::real( H.matrix()(1,0) ) ,  1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_NEAR( std::real( H.matrix()(0,1) ) ,  1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_NEAR( std::real( H.matrix()(1,1) ) , -1.0 / std::sqrt( 2.0 ) , tol ) ;
  EXPECT_EQ( std::imag( H.matrix()(0,0) ) , 0.0 ) ;
  EXPECT_EQ( std::imag( H.matrix()(1,0) ) , 0.0 ) ;
  EXPECT_EQ( std::imag( H.matrix()(0,1) ) , 0.0 ) ;
  EXPECT_EQ( std::imag( H.matrix()(1,1) ) , 0.0 ) ;

  // print
  H.print() ;

  // toQASM
  std::stringstream qasm ;
  EXPECT_EQ( H.toQASM( qasm ) , 0 ) ;
  EXPECT_EQ( qasm.str() , "h q[3];\n" ) ;
  std::cout << qasm.str() ;

  // operators == and !=
  qclab::qgates::Hadamard< T > H2 ;
  EXPECT_TRUE( H == H2 ) ;
  EXPECT_FALSE( H != H2 ) ;

  // apply
  {
    const R c = R(1) / std::sqrt( R(2) ) ;
    using V = std::vector< T > ;
    const V v1 = { 3 , 5 } ;
    const V v2 = { 3 , 5 , 2 , 7 } ;

    qclab::qgates::Hadamard< T >  H0( 0 ) ;
    qclab::qgates::Hadamard< T >  H1( 1 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    H0.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { c*T(3) + c*T(5) , c*T(3) - c*T(5) } ;
    check_Hadamard( vec1 , check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { H0.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    check_Hadamard( vec1 , check1 ) ;
  #endif

    vec1 = v1 ;
    H0.apply( qclab::Op::Trans , 1 , vec1 ) ;
    check_Hadamard( vec1 , check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { H0.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    check_Hadamard( vec1 , check1 ) ;
  #endif

    vec1 = v1 ;
    H0.apply( qclab::Op::ConjTrans , 1 , vec1 ) ;
    check_Hadamard( vec1 , check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { H0.apply_device( qclab::Op::ConjTrans , 1 , vec1_ ) ; }
    check_Hadamard( vec1 , check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    H0.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { c*T(3) + c*T(2) , c*T(5) + c*T(7) ,
                 c*T(3) - c*T(2) , c*T(5) - c*T(7) } ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H0.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H0.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H0.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H0.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H0.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H1.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { c*T(3) + c*T(5) , c*T(3) - c*T(5) ,
               c*T(2) + c*T(7) , c*T(2) - c*T(7) } ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H1.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H1.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H1.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif

    vec2 = v2 ;
    H1.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check_Hadamard( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { H1.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    check_Hadamard( vec2 , check2 ) ;
  #endif
  }

}